

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

Pos getLinkedGatewayPos(EndNoise *en,SurfaceNoise *sn,uint64_t seed,Pos src)

{
  Pos PVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint x;
  int x_00;
  long lVar10;
  float fVar11;
  Pos dst;
  float y [1089];
  
  PVar1 = getLinkedGatewayChunk(en,sn,seed,src,&dst);
  x = PVar1.x << 4;
  if (en->mc < 0x15) {
    iVar4 = PVar1.z << 4;
    pfVar5 = y;
    mapEndSurfaceHeight(pfVar5,en,sn,x,iVar4,0x10,0x10,1,0x1e);
    mapEndIslandHeight(pfVar5,en,seed,x,iVar4,0x10,0x10,1);
    uVar6 = 0;
    for (uVar2 = 0; uVar2 != 0x10; uVar2 = uVar2 + 1) {
      uVar7 = uVar2 | (long)iVar4;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        iVar9 = (int)pfVar5[lVar10];
        if ((0x1d < iVar9) &&
           (uVar8 = (ulong)(uint)(iVar9 * iVar9) +
                    ((int)x + lVar10) * ((int)x + lVar10) + uVar7 * uVar7, uVar6 < uVar8)) {
          dst.x = (int)lVar10 + PVar1.x * 0x10;
          dst.z = (int)uVar7;
          uVar6 = uVar8;
        }
      }
      pfVar5 = pfVar5 + 0x10;
    }
    iVar4 = 0;
    for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
      if ((float)iVar4 < y[lVar10]) {
        fVar11 = floorf(y[lVar10]);
        iVar4 = (int)fVar11;
      }
    }
  }
  else {
    dst.x = x | 0xf;
    dst.z = PVar1.z << 4 | 0xf;
    iVar4 = 0;
  }
  x_00 = dst.x + -0x10;
  iVar9 = dst.z + -0x10;
  pfVar5 = y;
  memset(pfVar5,0,0x1104);
  mapEndIslandHeight(pfVar5,en,seed,x_00,iVar9,0x21,0x21,1);
  for (lVar10 = 0; lVar10 != 0x441; lVar10 = lVar10 + 1) {
    if ((float)iVar4 < y[lVar10]) {
      fVar11 = floorf(y[lVar10]);
      iVar4 = (int)fVar11;
    }
  }
  mapEndSurfaceHeight(pfVar5,en,sn,x_00,iVar9,0x21,0x21,1,iVar4);
  mapEndIslandHeight(pfVar5,en,seed,x_00,iVar9,0x21,0x21,1);
  fVar11 = -1.0;
  for (lVar10 = 0; lVar10 != 0x21; lVar10 = lVar10 + 1) {
    iVar4 = iVar9;
    for (lVar3 = 0; lVar3 != 0x1104; lVar3 = lVar3 + 0x84) {
      if (fVar11 < *(float *)((long)pfVar5 + lVar3)) {
        fVar11 = *(float *)((long)pfVar5 + lVar3);
        dst.x = (int)lVar10 + x_00;
        dst.z = iVar4;
      }
      iVar4 = iVar4 + 1;
    }
    pfVar5 = pfVar5 + 1;
  }
  PVar1.z = dst.z;
  PVar1.x = dst.x;
  return PVar1;
}

Assistant:

Pos getLinkedGatewayPos(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed, Pos src)
{
    float y[33*33]; // buffer for [16][16] and [33][33]
    int ymin = 0;
    int i, j;

    Pos dst;
    Pos c = getLinkedGatewayChunk(en, sn, seed, src, &dst);

    if (en->mc > MC_1_16)
    {
        // The original java implementation has a bug where the result
        // variable for the in-chunk block search is assigned a reference
        // to the mutable iterator, which ends up as the last iteration
        // position and discards the found location.
        dst.x = c.x * 16 + 15;
        dst.z = c.z * 16 + 15;
    }
    else
    {
        mapEndSurfaceHeight(y, en, sn, c.x*16, c.z*16, 16, 16, 1, 30);
        mapEndIslandHeight(y, en, seed, c.x*16, c.z*16, 16, 16, 1);

        uint64_t d = 0;
        for (j = 0; j < 16; j++)
        {
            for (i = 0; i < 16; i++)
            {
                int v = (int) y[j*16 + i];
                if (v < 30) continue;
                uint64_t dx = 16*c.x + i;
                uint64_t dz = 16*c.z + j;
                uint64_t dr = dx*dx + dz*dz + v*v;
                if (dr > d)
                {
                    d = dr;
                    dst.x = dx;
                    dst.z = dz;
                }
            }
        }
        // use the previous result to retrieve the minimum y-level we know,
        // we can skip generation of surfaces that are lower than this
        for (i = 0; i < 16*16; i++)
            if (y[i] > ymin)
                ymin = (int) floor(y[i]);
    }

    Pos sp = { dst.x-16, dst.z-16 };
    // checking end islands is much cheaper than surface height generation, so
    // we can also skip surface generation lower than the highest island around
    memset(y, 0, sizeof(float)*33*33);
    mapEndIslandHeight(y, en, seed, sp.x, sp.z, 33, 33, 1);
    for (i = 0; i < 33*33; i++)
        if (y[i] > ymin)
            ymin = (int) floor(y[i]);

    mapEndSurfaceHeight(y, en, sn, sp.x, sp.z, 33, 33, 1, ymin);
    mapEndIslandHeight(y, en, seed, sp.x, sp.z, 33, 33, 1);

    float v = -1;
    for (i = 0; i < 33; i++)
    {
        for (j = 0; j < 33; j++)
        {
            if (y[j*33 + i] <= v)
                continue;
            v = y[j*33 + i];
            dst.x = sp.x + i;
            dst.z = sp.z + j;
        }
    }

    return dst;
}